

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O1

int FmsTagAddDescriptions
              (FmsTag tag,FmsIntType tag_type,void *tags,char **tag_descr,FmsInt num_tags)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  void *__ptr;
  char **__ptr_00;
  char *pcVar5;
  int iVar6;
  long lVar7;
  
  if (tag == (FmsTag)0x0) {
    iVar6 = 1;
  }
  else {
    iVar6 = 2;
    if (tag_type < FMS_NUM_INT_TYPES) {
      iVar6 = 3;
      if ((ulong)tag->tag_type != 8) {
        if (num_tags != 0) {
          if (tags == (void *)0x0) {
            return 4;
          }
          if (tag_descr == (char **)0x0) {
            return 5;
          }
          uVar1 = tag->num_tag_descriptions;
          __ptr = tag->described_tags;
          __ptr_00 = tag->tag_descriptions;
          sVar2 = FmsIntTypeSize[tag->tag_type];
          uVar3 = 1;
          do {
            uVar4 = uVar3;
            uVar3 = uVar4 * 2;
          } while (uVar4 < uVar1 + num_tags);
          if (uVar1 <= uVar4 >> 1) {
            __ptr = realloc(__ptr,uVar4 * sVar2);
            if (__ptr == (void *)0x0) {
              return 6;
            }
            tag->described_tags = __ptr;
            __ptr_00 = (char **)realloc(__ptr_00,uVar4 << 3);
            if (__ptr_00 == (char **)0x0) {
              return 6;
            }
            tag->tag_descriptions = __ptr_00;
          }
          FmsIntConvertCopy(tag_type,tags,tag->tag_type,(void *)(sVar2 * uVar1 + (long)__ptr),
                            num_tags);
          lVar7 = 0;
          do {
            if (tag_descr[lVar7] == (char *)0x0) {
              pcVar5 = (char *)0x0;
            }
            else {
              pcVar5 = strdup(tag_descr[lVar7]);
              if (pcVar5 == (char *)0x0) {
                for (; lVar7 != 0; lVar7 = lVar7 + -1) {
                  free(__ptr_00[uVar1 + lVar7 + -1]);
                }
                return 6;
              }
            }
            __ptr_00[uVar1 + lVar7] = pcVar5;
            lVar7 = lVar7 + 1;
          } while (num_tags + (num_tags == 0) != lVar7);
          tag->num_tag_descriptions = uVar1 + num_tags;
        }
        iVar6 = 0;
      }
    }
  }
  return iVar6;
}

Assistant:

int FmsTagAddDescriptions(FmsTag tag, FmsIntType tag_type, const void *tags,
                          const char *const *tag_descr, FmsInt num_tags) {
  if (!tag) { E_RETURN(1); }
  if (tag_type >= FMS_NUM_INT_TYPES) { E_RETURN(2); }
  if (tag->tag_type == FMS_NUM_INT_TYPES) { E_RETURN(3); }
  if (num_tags == 0) { return 0; }
  if (tags == NULL) { E_RETURN(4); }
  if (tag_descr == NULL) { E_RETURN(5); }
  const FmsInt num_tag_descriptions = tag->num_tag_descriptions;
  char *described_tags = tag->described_tags;
  char **tag_descriptions = tag->tag_descriptions;
  const size_t sizeof_tag_type = FmsIntTypeSize[tag->tag_type];
  const FmsInt nc = NextPow2(num_tag_descriptions + num_tags);
  if (num_tag_descriptions <= nc/2) {
    described_tags = realloc(described_tags, nc*sizeof_tag_type);
    if (described_tags == NULL) { E_RETURN(6); }
    tag->described_tags = described_tags;
    tag_descriptions = realloc(tag_descriptions, nc*sizeof(char*));
    if (tag_descriptions == NULL) { E_RETURN(6); }
    tag->tag_descriptions = tag_descriptions;
  }
  // Copy the new described tags
  FmsIntConvertCopy(tag_type, tags, tag->tag_type,
                    described_tags + num_tag_descriptions*sizeof_tag_type,
                    num_tags);
  // Copy the new description strings
  for (FmsInt i = 0; i < num_tags; i++) {
    if (FmsCopyString(tag_descr[i],
                      &tag_descriptions[num_tag_descriptions + i])) {
      while (i != 0) {
        free(tag_descriptions[num_tag_descriptions + (--i)]);
      }
      E_RETURN(6);
    }
  }
  // Update tag
  tag->num_tag_descriptions = num_tag_descriptions + num_tags;
  return 0;
}